

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

int __thiscall
QFusionStyle::pixelMetric
          (QFusionStyle *this,PixelMetric metric,QStyleOption *option,QWidget *widget)

{
  int iVar1;
  QStyle *pQVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  qreal in_RDI;
  qreal qVar3;
  int val;
  undefined4 in_stack_00000030;
  QCommonStyle *in_stack_00000040;
  QStyleOption *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  
  uVar4 = 0xffffffff;
  switch(in_ESI) {
  case 0:
    break;
  case 1:
  case 3:
  case 4:
    break;
  default:
    iVar1 = QCommonStyle::pixelMetric
                      (in_stack_00000040,this._4_4_,
                       (QStyleOption *)CONCAT44(metric,in_stack_00000030),(QWidget *)option);
    return iVar1;
  case 5:
    return 1;
  case 6:
    break;
  case 8:
    return -1;
  case 9:
    break;
  case 10:
    break;
  case 0xb:
  case 0xd:
    break;
  case 0xe:
    break;
  case 0x11:
  case 0x19:
    break;
  case 0x13:
    break;
  case 0x15:
    break;
  case 0x17:
    break;
  case 0x1a:
    break;
  case 0x1c:
  case 0x1d:
  case 0x1e:
    break;
  case 0x21:
  case 0x23:
  case 0x24:
    break;
  case 0x22:
    break;
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
    break;
  case 0x2e:
  case 0x42:
    break;
  case 0x34:
  case 0x37:
    break;
  case 0x35:
    break;
  case 0x36:
    break;
  case 0x3c:
    break;
  case 0x3e:
  case 0x48:
    break;
  case 0x46:
    break;
  case 0x47:
    break;
  case 0x49:
    break;
  case 0x53:
  case 0x54:
    break;
  case 0x55:
    break;
  case 0x56:
    pQVar2 = QStyle::proxy((QStyle *)CONCAT44(0xffffffff,in_stack_ffffffffffffffd0));
    iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x60,in_RDX,in_RCX,0);
    if (iVar1 != 0) {
      pQVar2 = QStyle::proxy((QStyle *)CONCAT44(uVar4,in_stack_ffffffffffffffd0));
      iVar1 = (**(code **)(*(long *)pQVar2 + 0xe0))(pQVar2,9,in_RDX,in_RCX);
      return iVar1;
    }
    break;
  case 0x57:
    break;
  case 0x5c:
  }
  qVar3 = QStyleHelper::dpiScaled(in_RDI,in_stack_ffffffffffffffb8);
  return (int)qVar3;
}

Assistant:

int QFusionStyle::pixelMetric(PixelMetric metric, const QStyleOption *option, const QWidget *widget) const
{
    int val = -1;
    switch (metric) {
    case PM_SliderTickmarkOffset:
        val = 4;
        break;
    case PM_HeaderMargin:
    case PM_ToolTipLabelFrameWidth:
        val = 2;
        break;
    case PM_ButtonDefaultIndicator:
    case PM_ButtonShiftHorizontal:
    case PM_ButtonShiftVertical:
        val = 0;
        break;
    case PM_MessageBoxIconSize:
        val = 48;
        break;
    case PM_ListViewIconSize:
        val = 24;
        break;
    case PM_ScrollBarSliderMin:
        val = 26;
        break;
    case PM_TitleBarHeight:
        val = 24;
        break;
    case PM_ScrollBarExtent:
        val = 14;
        break;
    case PM_SliderThickness:
    case PM_SliderLength:
        val = 15;
        break;
    case PM_DockWidgetTitleMargin:
        val = 1;
        break;
    case PM_SpinBoxFrameWidth:
        val = 3;
        break;
    case PM_MenuVMargin:
    case PM_MenuHMargin:
    case PM_MenuPanelWidth:
        val = 0;
        break;
    case PM_MenuBarItemSpacing:
        val = 6;
        break;
    case PM_MenuBarVMargin:
    case PM_MenuBarHMargin:
    case PM_MenuBarPanelWidth:
        val = 0;
        break;
    case PM_ToolBarHandleExtent:
        val = 9;
        break;
    case PM_ToolBarItemSpacing:
        val = 1;
        break;
    case PM_ToolBarFrameWidth:
    case PM_ToolBarItemMargin:
        val = 2;
        break;
    case PM_SmallIconSize:
    case PM_ButtonIconSize:
        val = 16;
        break;
    case PM_DockWidgetTitleBarButtonMargin:
        val = 2;
        break;
    case PM_ButtonMargin:
        val = 6;
        break;
    case PM_TitleBarButtonSize:
        val = 19;
        break;
    case PM_MaximumDragDistance:
        return -1; // Do not dpi-scale because the value is magic
    case PM_TabCloseIndicatorWidth:
    case PM_TabCloseIndicatorHeight:
        val = 20;
        break;
    case PM_TabBarTabVSpace:
        val = 12;
        break;
    case PM_TabBarTabOverlap:
        val = 1;
        break;
    case PM_TabBarBaseOverlap:
        val = 2;
        break;
    case PM_SubMenuOverlap:
        val = -1;
        break;
    case PM_DockWidgetHandleExtent:
    case PM_SplitterWidth:
        val = 4;
        break;
    case PM_IndicatorHeight:
    case PM_IndicatorWidth:
    case PM_ExclusiveIndicatorHeight:
    case PM_ExclusiveIndicatorWidth:
        val = 14;
        break;
    case PM_ScrollView_ScrollBarSpacing:
        val = 0;
        break;
    case PM_ScrollView_ScrollBarOverlap:
        if (proxy()->styleHint(SH_ScrollBar_Transient, option, widget))
            return proxy()->pixelMetric(PM_ScrollBarExtent, option, widget);
        val = 0;
        break;
    case PM_DefaultFrameWidth:
        return 1; // Do not dpi-scale because the drawn frame is always exactly 1 pixel thick
    default:
        return QCommonStyle::pixelMetric(metric, option, widget);
    }
    return QStyleHelper::dpiScaled(val, option);
}